

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O1

int cmSourceFileGetPropertyAsBool(void *arg,char *prop)

{
  cmSourceFile *this;
  bool bVar1;
  uint in_EAX;
  char *value;
  allocator<char> local_49;
  string local_48;
  
  this = *arg;
  if (this != (cmSourceFile *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,prop,&local_49);
    bVar1 = cmSourceFile::GetPropertyAsBool(this,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    in_EAX = (uint)bVar1;
  }
  if (this == (cmSourceFile *)0x0) {
    value = cmSourceFileGetProperty(arg,prop);
    bVar1 = cmValue::IsOn(value);
    in_EAX = (uint)bVar1;
  }
  return in_EAX;
}

Assistant:

static int CCONV cmSourceFileGetPropertyAsBool(void* arg, const char* prop)
{
  cmCPluginAPISourceFile* sf = static_cast<cmCPluginAPISourceFile*>(arg);
  if (cmSourceFile* rsf = sf->RealSourceFile) {
    return rsf->GetPropertyAsBool(prop) ? 1 : 0;
  }
  return cmIsOn(cmSourceFileGetProperty(arg, prop)) ? 1 : 0;
}